

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.cxx
# Opt level: O3

bool __thiscall
cmVariableRequiresCommand::InitialPass
          (cmVariableRequiresCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  pointer pbVar8;
  ulong uVar9;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string testVariable;
  string notSet;
  string resultVariable;
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  string local_98;
  cmState *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  bVar2 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0035,
                     "The variable_requires command should not be called; see CMP0035.");
  if (bVar2) {
    return true;
  }
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + pbVar8->_M_string_length);
  bVar2 = cmMakefile::IsOn((this->super_cmCommand).Makefile,&local_98);
  if (!bVar2) goto LAB_00328a03;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = pbVar8[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + pbVar8[1]._M_string_length);
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_78 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = true;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
    bVar4 = 0;
  }
  else {
    uVar9 = 2;
    uVar7 = 3;
    bVar4 = 0;
    do {
      bVar3 = cmMakefile::IsOn((this->super_cmCommand).Makefile,pbVar8 + uVar9);
      if (!bVar3) {
        std::__cxx11::string::_M_append
                  ((char *)&local_70,
                   (ulong)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_70);
        pcVar5 = cmState::GetCacheEntryValue
                           (local_78,(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar9);
        if (pcVar5 != (char *)0x0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"ADVANCED","");
          bVar2 = cmState::GetCacheEntryPropertyAsBool(local_78,pbVar8 + uVar9,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          bVar4 = bVar4 | bVar2;
        }
        bVar2 = false;
      }
      uVar9 = (ulong)uVar7;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
    } while (uVar9 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
    ;
  }
  pcVar5 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&local_50);
  if (pcVar5 == (char *)0x0) {
LAB_00328867:
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_50,bVar2);
    if (bVar2 == false) {
LAB_00328887:
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Variable assertion failed:\n","");
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      std::__cxx11::string::append((char *)local_b8);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8[0]);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_70);
      std::__cxx11::string::append((char *)&local_d8);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      std::__cxx11::string::append((char *)local_b8);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8[0]);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      if (bVar4 != 0) {
        std::__cxx11::string::append((char *)&local_d8);
      }
      cmSystemTools::Error(local_d8._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (bVar2 == false) {
    this_00 = (this->super_cmCommand).Makefile;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar5,pcVar5 + sVar6);
    bVar2 = cmMakefile::IsOn(this_00,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      bVar2 = false;
      goto LAB_00328867;
    }
    goto LAB_00328887;
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_00328a03:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmVariableRequiresCommand
::InitialPass(std::vector<std::string>const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0035,
      "The variable_requires command should not be called; see CMP0035."))
    { return true; }
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string testVariable = args[0];
  if(!this->Makefile->IsOn(testVariable))
    {
    return true;
    }
  std::string resultVariable = args[1];
  bool requirementsMet = true;
  std::string notSet;
  bool hasAdvanced = false;
  cmState* state = this->Makefile->GetState();
  for(unsigned int i = 2; i < args.size(); ++i)
    {
    if(!this->Makefile->IsOn(args[i]))
      {
      requirementsMet = false;
      notSet += args[i];
      notSet += "\n";
      if(state->GetCacheEntryValue(args[i]) &&
          state->GetCacheEntryPropertyAsBool(args[i], "ADVANCED"))
        {
        hasAdvanced = true;
        }
      }
    }
  const char* reqVar = this->Makefile->GetDefinition(resultVariable);
  // if reqVar is unset, then set it to requirementsMet
  // if reqVar is set to true, but requirementsMet is false , then
  // set reqVar to false.
  if(!reqVar || (!requirementsMet && this->Makefile->IsOn(reqVar)))
    {
    this->Makefile->AddDefinition(resultVariable, requirementsMet);
    }

  if(!requirementsMet)
    {
    std::string message = "Variable assertion failed:\n";
    message += testVariable +
      " Requires that the following unset variables are set:\n";
    message += notSet;
    message += "\nPlease set them, or set ";
    message += testVariable + " to false, and re-configure.\n";
    if(hasAdvanced)
      {
      message +=
        "One or more of the required variables is advanced."
        "  To set the variable, you must turn on advanced mode in cmake.";
      }
    cmSystemTools::Error(message.c_str());
    }

  return true;
}